

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.cpp
# Opt level: O3

maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> * __thiscall
anon_unknown.dwarf_12bad::Base64Decode::convert
          (maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *__return_storage_ptr__,Base64Decode *this,string *source)

{
  void *__dest;
  maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *pmVar1;
  maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *extraout_RAX;
  maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *extraout_RAX_00;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> in_R8;
  size_t __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
  oit;
  void *local_48;
  long lStack_40;
  long local_38;
  maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
  local_28;
  
  local_48 = (void *)0x0;
  lStack_40 = 0;
  local_38 = 0;
  pmVar1 = (maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
           pstore::
           from_base64<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                     (&local_28,(pstore *)this,
                      (char *)((long)&(source->_M_dataplus)._M_p +
                              (long)&(this->super_Test)._vptr_Test),
                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )&local_48,in_R8);
  if (local_28.valid_ == true) {
    __return_storage_ptr__->valid_ = true;
    (__return_storage_ptr__->storage_).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x10) = 0;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(__return_storage_ptr__->storage_).__align,lStack_40 - (long)local_48);
    __dest = *(void **)&__return_storage_ptr__->storage_;
    __n = lStack_40 - (long)local_48;
    pmVar1 = extraout_RAX;
    if (__n != 0) {
      pmVar1 = (maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               memmove(__dest,local_48,__n);
    }
    *(size_t *)((long)&__return_storage_ptr__->storage_ + 8) = (long)__dest + __n;
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x10) = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->storage_).__align = (anon_struct_8_0_00000001_for___align)0x0;
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
    pmVar1 = extraout_RAX_00;
  }
  return pmVar1;
}

Assistant:

auto Base64Decode::convert (std::string const & source) const -> pstore::maybe<container> {
        std::vector<std::uint8_t> out;
        std::back_insert_iterator<container> it = std::back_inserter (out);
        pstore::maybe<decltype (it)> const oit =
            pstore::from_base64 (std::begin (source), std::end (source), it);
        if (oit) {
            return pstore::just (out);
        }
        return pstore::nothing<container> ();
    }